

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

string * __thiscall
es32cts::RobustBufferAccessBehavior::UniformBufferTest::getComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,UniformBufferTest *this)

{
  VERSION VVar1;
  GLchar *__s;
  TestError *this_00;
  char *local_48;
  GLchar *source_offset;
  allocator<char> local_2a;
  undefined1 local_29;
  size_t local_28;
  size_t position;
  GLchar *destination_offset;
  UniformBufferTest *this_local;
  string *source;
  
  __s = getComputeShader::cs;
  local_28 = 0;
  local_29 = 0;
  destination_offset = (GLchar *)this;
  this_local = (UniformBufferTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_2a)
  ;
  std::allocator<char>::~allocator(&local_2a);
  VVar1 = (this->super_UniformBufferTest).m_test_case;
  if (VVar1 == VALID) {
    local_48 = "0";
  }
  else {
    if (VVar1 != SOURCE_INVALID) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                 ,0x527);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_48 = "16";
  }
  position = (long)"ivec2(0), 0" + 10;
  deqp::RobustBufferAccessBehavior::replaceToken("OFFSET",&local_28,"0",__return_storage_ptr__);
  deqp::RobustBufferAccessBehavior::replaceToken("OFFSET",&local_28,local_48,__return_storage_ptr__)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string UniformBufferTest::getComputeShader()
{
	static const GLchar* cs = "#version 320 es\n"
							  "\n"
							  "layout (local_size_x = 4, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "layout (binding = 0) uniform Source {\n"
							  "    float data[16];\n"
							  "} source;\n"
							  "\n"
							  "layout (binding = 0) buffer Destination {\n"
							  "    float data[];\n"
							  "} destination;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    uint index_destination = gl_LocalInvocationID.x + OFFSETU;\n"
							  "    uint index_source      = gl_LocalInvocationID.x + OFFSETU;\n"
							  "\n"
							  "    destination.data[index_destination] = source.data[index_source];\n"
							  "}\n"
							  "\n";

	const GLchar* destination_offset;
	size_t		  position = 0;
	std::string   source   = cs;
	const GLchar* source_offset;

	switch (m_test_case)
	{
	case VALID:
		destination_offset = "0";
		source_offset	  = "0";
		break;
	case SOURCE_INVALID:
		destination_offset = "0";
		source_offset	  = "16";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	replaceToken("OFFSET", position, destination_offset, source);
	replaceToken("OFFSET", position, source_offset, source);

	return source;
}